

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_commit.cxx
# Opt level: O2

void __thiscall
level_mesh::create_mappings
          (level_mesh *this,lw_face_vec *faces,lw_vmref_vec *vmrefs,xr_vmap_vec *vmaps,
          xr_remapper *face_remap,xr_remapper *vert_remap)

{
  pointer puVar1;
  uint32_t vert_idx;
  uint32_t face_idx;
  uint uVar2;
  uint32_t uVar3;
  uint *puVar4;
  uint_fast32_t uVar5;
  undefined4 uVar6;
  b_face *this_00;
  uint_fast32_t vert_idx_00;
  ulong uVar7;
  lw_vmref_entry local_f8;
  uint local_ec;
  lw_vmref_entry local_e8;
  long local_d0;
  lw_vmref_entry local_b8;
  lw_face_vec *local_b0;
  xr_remapper *local_a8;
  uint_fast32_t local_a0;
  uint *local_98;
  uint *local_90;
  lw_vmref vmref;
  lw_vmref vmref0;
  
  vert_idx_00 = (uint_fast32_t)vert_remap->m_min;
  puVar1 = (this->super_xr_mesh_builder).m_vertex_faces.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = puVar1 + vert_idx_00;
  local_90 = puVar1 + (ulong)vert_remap->m_max + 1;
  local_f8.vmap = 0;
  local_f8.offset = 0;
  local_e8.vmap = 0;
  local_e8.offset = 0;
  local_b0 = faces;
  local_a8 = vert_remap;
  while( true ) {
    if (puVar4 == local_90) {
      return;
    }
    uVar5 = vert_idx_00;
    if ((*puVar4 != 0xffffffff) &&
       (vert_idx = xray_re::xr_remapper::operator[](local_a8,(uint32_t)vert_idx_00),
       vert_idx != 0xffffffff)) break;
LAB_0012a49b:
    puVar4 = puVar4 + 1;
    vert_idx_00 = (uint_fast32_t)((int)uVar5 + 1);
  }
  vmref0.count = 0;
  local_d0 = 0;
  local_ec = 0xffffffff;
  local_98 = puVar4;
  do {
    uVar2 = *puVar4;
    while( true ) {
      puVar4 = local_98;
      if (uVar2 == 0xffffffff) goto LAB_0012a49b;
      this_00 = (this->super_xr_mesh_builder).m_faces.
                super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar2;
      face_idx = xray_re::xr_remapper::operator[](face_remap,uVar2);
      if (face_idx != 0xffffffff) break;
      uVar2 = xray_re::xr_mesh_builder::b_face::next_face_idx(this_00,vert_idx_00);
    }
    local_a0 = uVar5;
    uVar5 = xray_re::xr_mesh_builder::b_face::local_vert_idx(this_00,vert_idx_00);
    uVar2 = *(uint *)((long)&this_00->field_0 + uVar5 * 4 + 0x18);
    uVar7 = (ulong)uVar2;
    if (uVar7 == 0xffffffff) {
      __assert_fail("tc != BAD_IDX",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh_commit.cxx"
                    ,0x3a,
                    "void level_mesh::create_mappings(lw_face_vec &, lw_vmref_vec &, xr_vmap_vec &, const xr_remapper &, const xr_remapper &) const"
                   );
    }
    if (local_ec == 0xffffffff) {
      if (local_e8 == (lw_vmref_entry)0x0) {
        local_e8 = (lw_vmref_entry)operator_new(0x58);
        xray_re::xr_uv_vmap::xr_uv_vmap((xr_uv_vmap *)local_e8,"Texture");
        vmref.array[0] = local_e8;
        std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>::
        emplace_back<xray_re::xr_vmap*>
                  ((vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>> *)vmaps,
                   (xr_vmap **)&vmref);
      }
      uVar3 = xray_re::xr_uv_vmap::add_uv
                        ((xr_uv_vmap *)local_e8,
                         (this->super_xr_mesh_builder).m_texcoords.
                         super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar7,vert_idx);
      vmref.array[0] = (lw_vmref_entry)((ulong)uVar3 << 0x20);
      xray_re::_svector<xray_re::lw_vmref_entry,_5U>::push_back(&vmref0,vmref.array);
      local_d0 = ((long)(vmrefs->
                        super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(vmrefs->
                       super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x2c;
      std::
      vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
      ::push_back(vmrefs,&vmref0);
      uVar6 = (undefined4)local_d0;
    }
    else if (local_ec == uVar2) {
      uVar6 = (undefined4)local_d0;
      uVar2 = local_ec;
    }
    else {
      if (local_f8 == (lw_vmref_entry)0x0) {
        local_f8 = (lw_vmref_entry)operator_new(0x70);
        xray_re::xr_face_uv_vmap::xr_face_uv_vmap((xr_face_uv_vmap *)local_f8,"Texture");
        vmref.array[0] = local_f8;
        std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>::
        emplace_back<xray_re::xr_vmap*>
                  ((vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>> *)vmaps,
                   (xr_vmap **)&vmref);
      }
      vmref.count = 0;
      local_b8.offset =
           xray_re::xr_face_uv_vmap::add_uv
                     ((xr_face_uv_vmap *)local_f8,
                      (this->super_xr_mesh_builder).m_texcoords.
                      super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar7,vert_idx,face_idx);
      local_b8.vmap = 1;
      xray_re::_svector<xray_re::lw_vmref_entry,_5U>::push_back(&vmref,&local_b8);
      uVar6 = (undefined4)
              (((long)(vmrefs->
                      super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(vmrefs->
                     super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x2c);
      std::
      vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
      ::push_back(vmrefs,&vmref);
      uVar2 = local_ec;
    }
    *(undefined4 *)
     ((long)&(local_b0->super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>).
             _M_impl.super__Vector_impl_data._M_start[face_idx].field_0 + uVar5 * 4 + 0xc) = uVar6;
    puVar4 = (uint *)((long)&this_00->field_0 + uVar5 * 4 + 0x24);
    uVar5 = local_a0;
    local_ec = uVar2;
  } while( true );
}

Assistant:

void level_mesh::create_mappings(lw_face_vec& faces, lw_vmref_vec& vmrefs, xr_vmap_vec& vmaps,
		const xr_remapper& face_remap, const xr_remapper& vert_remap) const
{
	xr_uv_vmap* uv_vmap = 0;
	xr_face_uv_vmap* face_uv_vmap = 0;
	uint32_t vert_idx = vert_remap.min();
	for (std::vector<uint32_t>::const_iterator it = m_vertex_faces.begin() + vert_idx,
			end = m_vertex_faces.begin() + vert_remap.max() + 1; it != end; ++it, ++vert_idx) {
		if (*it == BAD_IDX)
			continue;
		uint32_t mapped_vert_idx = vert_remap[vert_idx];
		if (mapped_vert_idx == BAD_IDX)
			continue;

		lw_vmref vmref0;
		uint32_t tc0 = BAD_IDX, vmref0_idx = 0;
		for (uint32_t face_idx = *it; face_idx != BAD_IDX;) {
			const b_face& face = m_faces[face_idx];
			uint32_t mapped_face_idx = face_remap[face_idx];
			if (mapped_face_idx == BAD_IDX) {
				face_idx = face.next_face_idx(vert_idx);
				continue;
			}
			uint_fast32_t local_idx = face.local_vert_idx(vert_idx);
			uint32_t tc = face.tc[local_idx], vmref_idx;
			xr_assert(tc != BAD_IDX);
			if (tc0 == BAD_IDX) {
				if (uv_vmap == 0) {
					uv_vmap = new xr_uv_vmap("Texture");
					vmaps.push_back(uv_vmap);
				}
				vmref0.push_back(lw_vmref_entry(0, uv_vmap->add_uv(
						m_texcoords[tc0 = tc], mapped_vert_idx)));
				vmref0_idx = vmref_idx = uint32_t(vmrefs.size() & UINT32_MAX);
				vmrefs.push_back(vmref0);
			} else if (tc0 == tc) {
				vmref_idx = vmref0_idx;
			} else {
				if (face_uv_vmap == 0) {
					face_uv_vmap = new xr_face_uv_vmap("Texture");
					vmaps.push_back(face_uv_vmap);
				}
				lw_vmref vmref;
				vmref.push_back(lw_vmref_entry(1, face_uv_vmap->add_uv(
						m_texcoords[tc], mapped_vert_idx, mapped_face_idx)));
				vmref_idx = uint32_t(vmrefs.size() & UINT32_MAX);
				vmrefs.push_back(vmref);
			}
			faces[mapped_face_idx].ref[local_idx] = vmref_idx;
			face_idx = face.link[local_idx];
		}
	}
#if 0
	for (lw_face_vec_it it = faces.begin(); it != faces.end(); ++it) {
		if (it->ref0 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		if (it->ref1 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		if (it->ref2 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		xr_assert(it->ref0 < vmrefs.size());
		xr_assert(it->ref1 < vmrefs.size());
		xr_assert(it->ref2 < vmrefs.size());
	}
#endif
}